

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int fts5ExprGetToken(Fts5Parse *pParse,char **pz,Fts5Token *pToken)

{
  char cVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  long *in_RDX;
  long *in_RSI;
  Fts5Parse *in_RDI;
  char *z2_1;
  char *z2;
  int tok;
  char *z;
  char *local_40;
  char *local_38;
  int local_2c;
  char *local_28;
  
  local_28 = (char *)*in_RSI;
  while (iVar3 = fts5ExprIsspace(*local_28), iVar3 != 0) {
    local_28 = local_28 + 1;
  }
  *in_RDX = (long)local_28;
  *(undefined4 *)(in_RDX + 1) = 1;
  cVar1 = *local_28;
  iVar3 = (int)cVar1;
  if (cVar1 == '\0') {
    local_2c = 0;
  }
  else {
    iVar2 = (int)local_28;
    if (iVar3 == 0x22) {
      local_2c = 9;
      while ((local_38 = local_28 + 1, *local_38 != '\"' ||
             (local_38 = local_28 + 2, *local_38 == '\"'))) {
        local_28 = local_38;
        if (*local_38 == '\0') {
          sqlite3Fts5ParseError(in_RDI,"unterminated string");
          return 0;
        }
      }
      *(int *)(in_RDX + 1) = (int)local_38 - iVar2;
    }
    else if (iVar3 == 0x28) {
      local_2c = 10;
    }
    else if (iVar3 == 0x29) {
      local_2c = 0xb;
    }
    else if (iVar3 == 0x2a) {
      local_2c = 0xf;
    }
    else if (iVar3 == 0x2b) {
      local_2c = 0xe;
    }
    else if (iVar3 == 0x2c) {
      local_2c = 0xd;
    }
    else if (iVar3 == 0x2d) {
      local_2c = 6;
    }
    else if (iVar3 == 0x3a) {
      local_2c = 5;
    }
    else if (iVar3 == 0x5e) {
      local_2c = 0xc;
    }
    else if (iVar3 == 0x7b) {
      local_2c = 7;
    }
    else if (iVar3 == 0x7d) {
      local_2c = 8;
    }
    else {
      iVar4 = sqlite3Fts5IsBareword(cVar1 >> 7);
      if (iVar4 == 0) {
        sqlite3Fts5ParseError(in_RDI,"fts5: syntax error near \"%.1s\"",local_28);
        return 0;
      }
      local_2c = 9;
      do {
        local_40 = local_28 + 1;
        iVar4 = sqlite3Fts5IsBareword((char)((uint)iVar3 >> 0x18));
        local_28 = local_40;
      } while (iVar4 != 0);
      *(int *)(in_RDX + 1) = (int)local_40 - iVar2;
      if (((int)in_RDX[1] == 2) && (*(short *)*in_RDX == 0x524f)) {
        local_2c = 1;
      }
      if (((int)in_RDX[1] == 3) && (iVar3 = memcmp((void *)*in_RDX,"NOT",3), iVar3 == 0)) {
        local_2c = 3;
      }
      if (((int)in_RDX[1] == 3) && (iVar3 = memcmp((void *)*in_RDX,"AND",3), iVar3 == 0)) {
        local_2c = 2;
      }
    }
  }
  *in_RSI = *in_RDX + (long)(int)in_RDX[1];
  return local_2c;
}

Assistant:

static int fts5ExprGetToken(
  Fts5Parse *pParse,
  const char **pz,                /* IN/OUT: Pointer into buffer */
  Fts5Token *pToken
){
  const char *z = *pz;
  int tok;

  /* Skip past any whitespace */
  while( fts5ExprIsspace(*z) ) z++;

  pToken->p = z;
  pToken->n = 1;
  switch( *z ){
    case '(':  tok = FTS5_LP;    break;
    case ')':  tok = FTS5_RP;    break;
    case '{':  tok = FTS5_LCP;   break;
    case '}':  tok = FTS5_RCP;   break;
    case ':':  tok = FTS5_COLON; break;
    case ',':  tok = FTS5_COMMA; break;
    case '+':  tok = FTS5_PLUS;  break;
    case '*':  tok = FTS5_STAR;  break;
    case '-':  tok = FTS5_MINUS; break;
    case '^':  tok = FTS5_CARET; break;
    case '\0': tok = FTS5_EOF;   break;

    case '"': {
      const char *z2;
      tok = FTS5_STRING;

      for(z2=&z[1]; 1; z2++){
        if( z2[0]=='"' ){
          z2++;
          if( z2[0]!='"' ) break;
        }
        if( z2[0]=='\0' ){
          sqlite3Fts5ParseError(pParse, "unterminated string");
          return FTS5_EOF;
        }
      }
      pToken->n = (z2 - z);
      break;
    }

    default: {
      const char *z2;
      if( sqlite3Fts5IsBareword(z[0])==0 ){
        sqlite3Fts5ParseError(pParse, "fts5: syntax error near \"%.1s\"", z);
        return FTS5_EOF;
      }
      tok = FTS5_STRING;
      for(z2=&z[1]; sqlite3Fts5IsBareword(*z2); z2++);
      pToken->n = (z2 - z);
      if( pToken->n==2 && memcmp(pToken->p, "OR", 2)==0 )  tok = FTS5_OR;
      if( pToken->n==3 && memcmp(pToken->p, "NOT", 3)==0 ) tok = FTS5_NOT;
      if( pToken->n==3 && memcmp(pToken->p, "AND", 3)==0 ) tok = FTS5_AND;
      break;
    }
  }

  *pz = &pToken->p[pToken->n];
  return tok;
}